

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void cfd::api::json::DecodePsbtInput::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> func_table;
  _Any_data local_f8;
  undefined1 local_e8 [16];
  code *local_d8 [2];
  code *local_c8;
  code *pcStack_c0;
  code *local_b8 [2];
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetNon_witness_utxo_hexString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetNon_witness_utxo_hexString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetNon_witness_utxo_hexFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[21],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [21])"non_witness_utxo_hex",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"non_witness_utxo_hex","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetNon_witness_utxoString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetNon_witness_utxoString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetNon_witness_utxoFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[17],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [17])"non_witness_utxo",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"non_witness_utxo","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetWitness_utxoString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetWitness_utxoString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetWitness_utxoFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [13])0x5f93cc,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"witness_utxo","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetPartial_signaturesString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetPartial_signaturesString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetPartial_signaturesFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[19],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [19])"partial_signatures",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"partial_signatures","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetSighashString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetSighashString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetSighashFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])"sighash",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"sighash","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetRedeem_scriptString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetRedeem_scriptString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetRedeem_scriptFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [14])0x5384d1,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"redeem_script","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetWitness_scriptString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetWitness_scriptString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetWitness_scriptFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[15],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [15])"witness_script",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"witness_script","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetBip32_derivsString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetBip32_derivsString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetBip32_derivsFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [13])"bip32_derivs",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"bip32_derivs","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetFinal_scriptsigString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetFinal_scriptsigString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetFinal_scriptsigFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"final_scriptsig",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"final_scriptsig","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetFinal_scriptwitnessString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetFinal_scriptwitnessString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetFinal_scriptwitnessFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[20],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [20])"final_scriptwitness",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"final_scriptwitness","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetUnknownString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetUnknownString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetUnknownFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>::operator=
              ((function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)&local_78,
               (function<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)> *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])0x5f928e,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"unknown","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}